

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall libtorrent::aux::peer_connection::on_metadata_impl(peer_connection *this)

{
  const_iterator cVar1;
  int iVar2;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar3;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar4;
  const_iterator cVar5;
  long lVar6;
  long lVar7;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_40;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&local_30,
             &(this->super_peer_connection_hot_members).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&local_30);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_30._M_refcount);
  bitfield::resize((bitfield *)&this->super_peer_connection_hot_members,
                   ((((local_40._M_ptr)->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_num_pieces,(bool)(this->field_0x887 & 1));
  iVar2 = bitfield::count((bitfield *)&this->super_peer_connection_hot_members);
  this->m_num_pieces = iVar2;
  psVar4 = (this->m_allowed_fast).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar1._M_current =
       (this->m_allowed_fast).
       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)cVar1._M_current - (long)psVar4;
  for (lVar7 = lVar6 >> 4; 0 < lVar7; lVar7 = lVar7 + -1) {
    cVar5._M_current = psVar4;
    if (iVar2 <= psVar4->m_val) goto LAB_00220cb6;
    if (iVar2 <= psVar4[1].m_val) {
      cVar5._M_current = psVar4 + 1;
      goto LAB_00220cb6;
    }
    if (iVar2 <= psVar4[2].m_val) {
      cVar5._M_current = psVar4 + 2;
      goto LAB_00220cb6;
    }
    if (iVar2 <= psVar4[3].m_val) {
      cVar5._M_current = psVar4 + 3;
      goto LAB_00220cb6;
    }
    psVar4 = psVar4 + 4;
    lVar6 = lVar6 + -0x10;
  }
  lVar6 = lVar6 >> 2;
  if (lVar6 == 1) {
LAB_00220c9e:
    cVar5._M_current = psVar4;
    if (psVar4->m_val < iVar2) {
      cVar5._M_current = cVar1._M_current;
    }
LAB_00220cb6:
    psVar4 = cVar5._M_current;
    if (cVar5._M_current != cVar1._M_current) {
      while (psVar3 = cVar5._M_current + 1, cVar5._M_current = psVar4, psVar3 != cVar1._M_current) {
        cVar5._M_current = psVar3;
        if (psVar3->m_val < iVar2) {
          psVar4->m_val = psVar3->m_val;
          psVar4 = psVar4 + 1;
        }
      }
    }
  }
  else {
    if (lVar6 == 2) {
LAB_00220c96:
      cVar5._M_current = psVar4;
      if (psVar4->m_val < iVar2) {
        psVar4 = psVar4 + 1;
        goto LAB_00220c9e;
      }
      goto LAB_00220cb6;
    }
    cVar5._M_current = cVar1._M_current;
    if (lVar6 == 3) {
      cVar5._M_current = psVar4;
      if (psVar4->m_val < iVar2) {
        psVar4 = psVar4 + 1;
        goto LAB_00220c96;
      }
      goto LAB_00220cb6;
    }
  }
  ::std::
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ::erase(&this->m_allowed_fast,cVar5,cVar1);
  psVar4 = (this->m_suggested_pieces).
           super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar1._M_current =
       (this->m_suggested_pieces).
       super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       .
       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)cVar1._M_current - (long)psVar4;
  for (lVar7 = lVar6 >> 4; 0 < lVar7; lVar7 = lVar7 + -1) {
    cVar5._M_current = psVar4;
    if (iVar2 <= psVar4->m_val) goto LAB_00220d6d;
    if (iVar2 <= psVar4[1].m_val) {
      cVar5._M_current = psVar4 + 1;
      goto LAB_00220d6d;
    }
    if (iVar2 <= psVar4[2].m_val) {
      cVar5._M_current = psVar4 + 2;
      goto LAB_00220d6d;
    }
    if (iVar2 <= psVar4[3].m_val) {
      cVar5._M_current = psVar4 + 3;
      goto LAB_00220d6d;
    }
    psVar4 = psVar4 + 4;
    lVar6 = lVar6 + -0x10;
  }
  lVar6 = lVar6 >> 2;
  if (lVar6 == 1) {
LAB_00220d55:
    cVar5._M_current = psVar4;
    if (psVar4->m_val < iVar2) {
      cVar5._M_current = cVar1._M_current;
    }
  }
  else if (lVar6 == 2) {
LAB_00220d4d:
    cVar5._M_current = psVar4;
    if (psVar4->m_val < iVar2) {
      psVar4 = psVar4 + 1;
      goto LAB_00220d55;
    }
  }
  else {
    cVar5._M_current = cVar1._M_current;
    if (lVar6 != 3) goto LAB_00220d97;
    cVar5._M_current = psVar4;
    if (psVar4->m_val < iVar2) {
      psVar4 = psVar4 + 1;
      goto LAB_00220d4d;
    }
  }
LAB_00220d6d:
  psVar4 = cVar5._M_current;
  if (cVar5._M_current != cVar1._M_current) {
    while (psVar3 = cVar5._M_current + 1, cVar5._M_current = psVar4, psVar3 != cVar1._M_current) {
      cVar5._M_current = psVar3;
      if (psVar3->m_val < iVar2) {
        psVar4->m_val = psVar3->m_val;
        psVar4 = psVar4 + 1;
      }
    }
  }
LAB_00220d97:
  ::std::
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ::erase(&(this->m_suggested_pieces).
           super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ,cVar5,cVar1);
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[8])(this);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void peer_connection::on_metadata_impl()
	{
		TORRENT_ASSERT(is_single_thread());
		auto t = associated_torrent().lock();
		m_have_piece.resize(t->torrent_file().num_pieces(), m_have_all);
		m_num_pieces = m_have_piece.count();

		piece_index_t const limit(m_num_pieces);

		// now that we know how many pieces there are
		// remove any invalid allowed_fast and suggest pieces
		// now that we know what the number of pieces are
		m_allowed_fast.erase(std::remove_if(m_allowed_fast.begin(), m_allowed_fast.end()
			, [=](piece_index_t const p) { return p >= limit; })
			, m_allowed_fast.end());

		// remove any piece suggested to us whose index is invalid
		// now that we know how many pieces there are
		m_suggested_pieces.erase(
			std::remove_if(m_suggested_pieces.begin(), m_suggested_pieces.end()
				, [=](piece_index_t const p) { return p >= limit; })
			, m_suggested_pieces.end());

		on_metadata();
		if (m_disconnecting) return;
	}